

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O0

Index __thiscall ProblemAloha::composeObservation(ProblemAloha *this,Index status,Index newPacket)

{
  Index IVar1;
  reference pvVar2;
  value_type in_EDX;
  value_type in_ESI;
  allocator_type *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> splitO;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 *__n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc0;
  undefined1 local_29;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  value_type local_10;
  value_type local_c;
  
  __n = &local_29;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9ab4ea);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffc0,(size_type)__n,in_RDI);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9ab50a);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_28,0);
  *pvVar2 = local_c;
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_28,1);
  *pvVar2 = local_10;
  IVar1 = IndexTools::IndividualToJointIndicesStepSize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
                     (size_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  return IVar1;
}

Assistant:

Index ProblemAloha::composeObservation(Index status, Index newPacket) const
{
    vector<Index> splitO(2);
    splitO[0]=status;
    splitO[1]=newPacket;
    return(IndexTools::IndividualToJointIndicesStepSize(splitO,
                                                        _m_stepSizeObservations));
}